

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TiledInputFile::Data::readTiles(Data *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  exr_result_t eVar1;
  ostream *poVar2;
  undefined8 uVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  stringstream _iex_throw_s_1;
  exr_result_t rv_1;
  int tx_1;
  int ty_1;
  TileProcess tp;
  stringstream _iex_throw_s;
  exr_result_t rv;
  int tx;
  int ty;
  TaskGroup tg;
  TileProcessGroup tpg;
  exr_chunk_info_t cinfo;
  int nTiles;
  exr_chunk_info_t *peVar4;
  TileProcess *in_stack_fffffffffffff900;
  ProcessGroup<Imf_3_3::(anonymous_namespace)::TileProcess,_true> *in_stack_fffffffffffff910;
  exr_chunk_info_t *in_stack_fffffffffffff918;
  FrameBuffer *in_stack_fffffffffffff920;
  TileProcessGroup *in_stack_fffffffffffff928;
  Data *in_stack_fffffffffffff930;
  TaskGroup *in_stack_fffffffffffff938;
  ProcessGroup<Imf_3_3::(anonymous_namespace)::TileProcess,_true> *in_stack_fffffffffffff940;
  vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_> *in_stack_fffffffffffff970;
  FrameBuffer *in_stack_fffffffffffff978;
  undefined8 in_stack_fffffffffffff980;
  exr_const_context_t in_stack_fffffffffffff988;
  TileProcess *in_stack_fffffffffffff990;
  stringstream local_638 [16];
  ostream local_628 [4];
  int in_stack_fffffffffffff9dc;
  int in_stack_fffffffffffff9e0;
  int in_stack_fffffffffffff9e4;
  int in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  exr_const_context_t in_stack_fffffffffffff9f0;
  exr_chunk_info_t *in_stack_fffffffffffffa20;
  int local_4a8;
  int local_4a4;
  TileProcess local_4a0;
  stringstream local_258 [16];
  ostream local_248 [376];
  exr_result_t local_d0;
  int local_cc;
  int local_c8;
  exr_chunk_info_t local_60;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_20 = ((in_R8D - in_ECX) + 1) * ((in_EDX - in_ESI) + 1);
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  if ((local_20 < 2) || (*(int *)(in_RDI + 0xc) < 2)) {
    anon_unknown_13::TileProcess::TileProcess(&local_4a0);
    for (local_4a4 = local_14; local_4a4 <= local_18; local_4a4 = local_4a4 + 1) {
      for (local_4a8 = local_c; local_4a8 <= local_10; local_4a8 = local_4a8 + 1) {
        Context::operator_cast_to__priv_exr_context_t_((Context *)0x1861f0);
        peVar4 = &local_60;
        eVar1 = exr_read_tile_chunk_info
                          (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                           in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e4,
                           in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                           in_stack_fffffffffffffa20);
        if (eVar1 == 0x18) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_638);
          poVar2 = std::operator<<(local_628,"Tile (");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_4a8);
          poVar2 = std::operator<<(poVar2,", ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_4a4);
          poVar2 = std::operator<<(poVar2,", ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
          poVar2 = std::operator<<(poVar2,", ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_stack_00000008);
          std::operator<<(poVar2,") is missing.");
          uVar3 = __cxa_allocate_exception(0x48);
          Iex_3_3::InputExc::InputExc((InputExc *)in_stack_fffffffffffff900,(stringstream *)peVar4);
          __cxa_throw(uVar3,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
        }
        if (eVar1 != 0) {
          uVar3 = __cxa_allocate_exception(0x48);
          Iex_3_3::InputExc::InputExc((InputExc *)in_stack_fffffffffffff900,(char *)peVar4);
          __cxa_throw(uVar3,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
        }
        local_4a0.cinfo.sample_count_data_offset = local_60.sample_count_data_offset;
        local_4a0.cinfo.sample_count_table_size = local_60.sample_count_table_size;
        local_4a0.cinfo.packed_size = local_60.packed_size;
        local_4a0.cinfo.unpacked_size = local_60.unpacked_size;
        local_4a0.cinfo.width = local_60.width;
        local_4a0.cinfo.level_x = local_60.level_x;
        local_4a0.cinfo.level_y = local_60.level_y;
        local_4a0.cinfo.type = local_60.type;
        local_4a0.cinfo.compression = local_60.compression;
        local_4a0.cinfo.data_offset = local_60.data_offset;
        local_4a0.cinfo.idx = local_60.idx;
        local_4a0.cinfo.start_x = local_60.start_x;
        local_4a0.cinfo.start_y = local_60.start_y;
        local_4a0.cinfo.height = local_60.height;
        Context::operator_cast_to__priv_exr_context_t_((Context *)0x1864a0);
        anon_unknown_13::TileProcess::run_decode
                  (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                   (int)((ulong)in_stack_fffffffffffff980 >> 0x20),in_stack_fffffffffffff978,
                   in_stack_fffffffffffff970);
      }
    }
    anon_unknown_13::TileProcess::~TileProcess(in_stack_fffffffffffff900);
  }
  else {
    IlmThread_3_3::ProcessGroup<Imf_3_3::(anonymous_namespace)::TileProcess,_true>::ProcessGroup
              ((ProcessGroup<Imf_3_3::(anonymous_namespace)::TileProcess,_true> *)
               in_stack_fffffffffffff930,(uint)((ulong)in_stack_fffffffffffff928 >> 0x20));
    IlmThread_3_3::TaskGroup::TaskGroup((TaskGroup *)in_stack_fffffffffffff910);
    for (local_c8 = local_14; local_c8 <= local_18; local_c8 = local_c8 + 1) {
      for (local_cc = local_c; local_cc <= local_10; local_cc = local_cc + 1) {
        Context::operator_cast_to__priv_exr_context_t_((Context *)0x185dee);
        peVar4 = &local_60;
        local_d0 = exr_read_tile_chunk_info
                             (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                              in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e4,
                              in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                              in_stack_fffffffffffffa20);
        if (local_d0 == 0x18) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_258);
          poVar2 = std::operator<<(local_248,"Tile (");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_cc);
          poVar2 = std::operator<<(poVar2,", ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c8);
          poVar2 = std::operator<<(poVar2,", ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
          poVar2 = std::operator<<(poVar2,", ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_stack_00000008);
          std::operator<<(poVar2,") is missing.");
          uVar3 = __cxa_allocate_exception(0x48);
          Iex_3_3::InputExc::InputExc((InputExc *)in_stack_fffffffffffff900,(stringstream *)peVar4);
          __cxa_throw(uVar3,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
        }
        if (local_d0 != 0) {
          uVar3 = __cxa_allocate_exception(0x48);
          Iex_3_3::InputExc::InputExc((InputExc *)in_stack_fffffffffffff900,(char *)peVar4);
          __cxa_throw(uVar3,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
        }
        operator_new(0x30);
        TileBufferTask::TileBufferTask
                  ((TileBufferTask *)in_stack_fffffffffffff940,in_stack_fffffffffffff938,
                   in_stack_fffffffffffff930,in_stack_fffffffffffff928,in_stack_fffffffffffff920,
                   in_stack_fffffffffffff918);
        IlmThread_3_3::ThreadPool::addGlobalTask((Task *)0x1860eb);
      }
    }
    IlmThread_3_3::TaskGroup::~TaskGroup((TaskGroup *)in_stack_fffffffffffff900);
    IlmThread_3_3::ProcessGroup<Imf_3_3::(anonymous_namespace)::TileProcess,_true>::throw_on_failure
              (in_stack_fffffffffffff940);
    IlmThread_3_3::ProcessGroup<Imf_3_3::(anonymous_namespace)::TileProcess,_true>::~ProcessGroup
              (in_stack_fffffffffffff910);
  }
  return;
}

Assistant:

void TiledInputFile::Data::readTiles (int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    int nTiles = dx2 - dx1 + 1;
    nTiles *= dy2 - dy1 + 1;

    exr_chunk_info_t      cinfo;
#if ILMTHREAD_THREADING_ENABLED
    if (nTiles > 1 && numThreads > 1)
    {
        // we need the lifetime of this to last longer than the
        // lifetime of the task group below such that we don't get use
        // after free type error, so use scope rules to accomplish
        // this
        TileProcessGroup tpg (numThreads);

        {
            ILMTHREAD_NAMESPACE::TaskGroup tg;

            for (int ty = dy1; ty <= dy2; ++ty)
            {
                for (int tx = dx1; tx <= dx2; ++tx)
                {
                    exr_result_t rv = exr_read_tile_chunk_info (
                        *_ctxt, partNumber, tx, ty, lx, ly, &cinfo);
                    if (EXR_ERR_INCOMPLETE_CHUNK_TABLE == rv)
                    {
                        THROW (
                            IEX_NAMESPACE::InputExc,
                            "Tile (" << tx << ", " << ty << ", " << lx << ", " << ly
                            << ") is missing.");
                    }
                    else if (EXR_ERR_SUCCESS != rv)
                        throw IEX_NAMESPACE::InputExc ("Unable to query tile information");

                    ILMTHREAD_NAMESPACE::ThreadPool::addGlobalTask (
                        new TileBufferTask (&tg, this, &tpg, &frameBuffer, cinfo) );
                }
            }
        }

        tpg.throw_on_failure ();
    }
    else
#endif
    {
        TileProcess tp;

        for (int ty = dy1; ty <= dy2; ++ty)
        {
            for (int tx = dx1; tx <= dx2; ++tx)
            {
                exr_result_t rv = exr_read_tile_chunk_info (
                    *_ctxt, partNumber, tx, ty, lx, ly, &cinfo);
                if (EXR_ERR_INCOMPLETE_CHUNK_TABLE == rv)
                {
                    THROW (
                        IEX_NAMESPACE::InputExc,
                        "Tile (" << tx << ", " << ty << ", " << lx << ", " << ly
                        << ") is missing.");
                }
                else if (EXR_ERR_SUCCESS != rv)
                    throw IEX_NAMESPACE::InputExc ("Unable to query tile information");

                tp.cinfo = cinfo;
                tp.run_decode (
                    *_ctxt,
                    partNumber,
                    &frameBuffer,
                    fill_list);
            }
        }
    }
}